

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

Vector<unsigned_int,_4>
deqp::gles3::Functional::FboTestUtil::castVectorSaturate<unsigned_int>(Vec4 *in)

{
  float fVar1;
  undefined4 uVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 *in_RDI;
  undefined4 uVar5;
  Vector<unsigned_int,_4> VVar6;
  
  fVar1 = in->m_data[0];
  uVar2 = 0xffffffff;
  lVar3 = 0xffffffff;
  if ((fVar1 + 0.5 < 4.2949673e+09) && (lVar3 = 0, 0.0 < fVar1 + -0.5)) {
    lVar3 = (long)fVar1;
  }
  fVar1 = in->m_data[1];
  if ((fVar1 + 0.5 < 4.2949673e+09) && (uVar2 = 0, 0.0 < fVar1 + -0.5)) {
    uVar2 = (undefined4)(long)fVar1;
  }
  fVar1 = in->m_data[2];
  uVar4 = 0xffffffff;
  uVar5 = 0xffffffff;
  if ((fVar1 + 0.5 < 4.2949673e+09) && (uVar5 = 0, 0.0 < fVar1 + -0.5)) {
    uVar5 = (undefined4)(long)fVar1;
  }
  fVar1 = in->m_data[3];
  if ((fVar1 + 0.5 < 4.2949673e+09) && (uVar4 = 0, 0.0 < fVar1 + -0.5)) {
    uVar4 = (undefined4)(long)fVar1;
  }
  *in_RDI = (int)lVar3;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar5;
  in_RDI[3] = uVar4;
  VVar6.m_data[2] = (int)lVar3;
  VVar6.m_data[3] = (int)((ulong)lVar3 >> 0x20);
  VVar6.m_data._0_8_ = in_RDI;
  return (Vector<unsigned_int,_4>)VVar6.m_data;
}

Assistant:

static tcu::Vector<T, 4> castVectorSaturate (const tcu::Vec4& in)
{
	return tcu::Vector<T, 4>((in.x() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.x() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.x()))),
	                         (in.y() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.y() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.y()))),
							 (in.z() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.z() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.z()))),
							 (in.w() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.w() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.w()))));
}